

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::CheckDeclaredFunc(SharedValidator *this,Var *func_var)

{
  Result RVar1;
  char *pcVar2;
  size_type sVar3;
  int in_EDX;
  key_type local_1c;
  
  pcVar2 = Var::index(func_var,(char *)func_var,in_EDX);
  local_1c = (key_type)pcVar2;
  sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    (&this->declared_funcs_,&local_1c);
  RVar1.enum_ = Ok;
  if (sVar3 == 0) {
    RVar1 = PrintError(this,&func_var->loc,"function is not declared in any elem sections");
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckDeclaredFunc(Var func_var) {
  if (declared_funcs_.count(func_var.index()) == 0) {
    return PrintError(func_var.loc,
                      "function is not declared in any elem sections");
  }
  return Result::Ok;
}